

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_convert.cpp
# Opt level: O2

void test_one<char>(locale *l,string *src,string *tgtl,string *tgtu)

{
  int iVar1;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  runtime_error *prVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  locale local_80 [8];
  locale local_78 [8];
  locale local_70 [8];
  locale local_68 [8];
  locale local_60 [8];
  locale local_58 [8];
  string local_50;
  
  test_counter = test_counter + 1;
  std::locale::locale(local_58,l);
  to_correct_string<char>(&local_a0,src,local_58);
  booster::locale::to_upper<char>(&local_c0,&local_a0,l);
  std::locale::locale(local_60,l);
  to_correct_string<char>(&local_50,tgtu,local_60);
  _Var3 = std::operator==(&local_c0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::locale::~locale(local_60);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::locale::~locale(local_58);
  if (!_Var3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x1f);
    poVar4 = std::operator<<(poVar4,
                             " booster::locale::to_upper(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtu,l)"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar2) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_c0,"Error limits reached, stopping unit test",
                 (allocator *)&local_a0);
      booster::runtime_error::runtime_error(prVar5,&local_c0);
      __cxa_throw(prVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::locale::locale(local_68,l);
  to_correct_string<char>(&local_a0,src,local_68);
  booster::locale::to_lower<char>(&local_c0,&local_a0,l);
  std::locale::locale(local_70,l);
  to_correct_string<char>(&local_50,tgtl,local_70);
  _Var3 = std::operator==(&local_c0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::locale::~locale(local_70);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::locale::~locale(local_68);
  if (!_Var3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x20);
    poVar4 = std::operator<<(poVar4,
                             " booster::locale::to_lower(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtl,l)"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar2) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_c0,"Error limits reached, stopping unit test",
                 (allocator *)&local_a0);
      booster::runtime_error::runtime_error(prVar5,&local_c0);
      __cxa_throw(prVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::locale::locale(local_78,l);
  to_correct_string<char>(&local_a0,src,local_78);
  booster::locale::fold_case<char>(&local_c0,&local_a0,l);
  std::locale::locale(local_80,l);
  to_correct_string<char>(&local_50,tgtl,local_80);
  _Var3 = std::operator==(&local_c0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::locale::~locale(local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::locale::~locale(local_78);
  if (!_Var3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x21);
    poVar4 = std::operator<<(poVar4,
                             " booster::locale::fold_case(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtl,l)"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar2) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_c0,"Error limits reached, stopping unit test",
                 (allocator *)&local_a0);
      booster::runtime_error::runtime_error(prVar5,&local_c0);
      __cxa_throw(prVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void test_one(std::locale const &l,std::string src,std::string tgtl,std::string tgtu)
{
    TEST(booster::locale::to_upper(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtu,l));
    TEST(booster::locale::to_lower(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtl,l));
    TEST(booster::locale::fold_case(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtl,l));
}